

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vttdemux.cc
# Opt level: O0

void libwebm::vttdemux::BuildMap(Segment *segment,metadata_map_t *map_ptr)

{
  int iVar1;
  Chapters *pCVar2;
  mapped_type *pmVar3;
  char *__s1;
  undefined4 local_78;
  undefined4 uStack_74;
  MetadataInfo info_1;
  char *codec_id;
  long tn;
  Track *t;
  long idx;
  long tc;
  Tracks *tt;
  undefined4 local_30;
  undefined4 uStack_2c;
  MetadataInfo info;
  metadata_map_t *m;
  metadata_map_t *map_ptr_local;
  Segment *segment_local;
  
  info.file = (FILE *)map_ptr;
  std::
  map<long,_libwebm::vttdemux::MetadataInfo,_std::less<long>,_std::allocator<std::pair<const_long,_libwebm::vttdemux::MetadataInfo>_>_>
  ::clear(map_ptr);
  pCVar2 = mkvparser::Segment::GetChapters(segment);
  if (pCVar2 != (Chapters *)0x0) {
    info.type = kSubtitles;
    info._4_4_ = 0;
    local_30 = 4;
    tt = (Tracks *)0x0;
    pmVar3 = std::
             map<long,_libwebm::vttdemux::MetadataInfo,_std::less<long>,_std::allocator<std::pair<const_long,_libwebm::vttdemux::MetadataInfo>_>_>
             ::operator[]((map<long,_libwebm::vttdemux::MetadataInfo,_std::less<long>,_std::allocator<std::pair<const_long,_libwebm::vttdemux::MetadataInfo>_>_>
                           *)info.file,(key_type *)&tt);
    *(ulong *)pmVar3 = CONCAT44(uStack_2c,local_30);
    pmVar3->file = (FILE *)info._0_8_;
  }
  tc = (long)mkvparser::Segment::GetTracks(segment);
  if (((Tracks *)tc != (Tracks *)0x0) &&
     (idx = mkvparser::Tracks::GetTracksCount((Tracks *)tc), 0 < idx)) {
    for (t = (Track *)0x0; (long)t < idx; t = (Track *)((long)&t->_vptr_Track + 1)) {
      tn = (long)mkvparser::Tracks::GetTrackByIndex((Tracks *)tc,(unsigned_long)t);
      if ((((Track *)tn != (Track *)0x0) &&
          (codec_id = (char *)mkvparser::Track::GetNumber((Track *)tn), 0 < (long)codec_id)) &&
         (__s1 = mkvparser::Track::GetCodecId((Track *)tn), __s1 != (char *)0x0)) {
        iVar1 = strcmp(__s1,"D_WEBVTT/SUBTITLES");
        if (iVar1 == 0) {
          local_78 = 0;
        }
        else {
          iVar1 = strcmp(__s1,"D_WEBVTT/CAPTIONS");
          if (iVar1 == 0) {
            local_78 = 1;
          }
          else {
            iVar1 = strcmp(__s1,"D_WEBVTT/DESCRIPTIONS");
            if (iVar1 == 0) {
              local_78 = 2;
            }
            else {
              iVar1 = strcmp(__s1,"D_WEBVTT/METADATA");
              if (iVar1 != 0) goto LAB_00119b9e;
              local_78 = 3;
            }
          }
        }
        pmVar3 = std::
                 map<long,_libwebm::vttdemux::MetadataInfo,_std::less<long>,_std::allocator<std::pair<const_long,_libwebm::vttdemux::MetadataInfo>_>_>
                 ::operator[]((map<long,_libwebm::vttdemux::MetadataInfo,_std::less<long>,_std::allocator<std::pair<const_long,_libwebm::vttdemux::MetadataInfo>_>_>
                               *)info.file,(key_type *)&codec_id);
        *(ulong *)pmVar3 = CONCAT44(uStack_74,local_78);
        pmVar3->file = (FILE *)0x0;
      }
LAB_00119b9e:
    }
  }
  return;
}

Assistant:

void vttdemux::BuildMap(const mkvparser::Segment* segment,
                        metadata_map_t* map_ptr) {
  metadata_map_t& m = *map_ptr;
  m.clear();

  if (segment->GetChapters()) {
    MetadataInfo info;
    info.file = NULL;
    info.type = MetadataInfo::kChapters;

    m[kChaptersKey] = info;
  }

  const mkvparser::Tracks* const tt = segment->GetTracks();
  if (tt == NULL)
    return;

  const long tc = tt->GetTracksCount();  // NOLINT
  if (tc <= 0)
    return;

  // Iterate over the tracks in the intput file.  We determine whether
  // a track holds metadata by inspecting its CodecID.

  for (long idx = 0; idx < tc; ++idx) {  // NOLINT
    const mkvparser::Track* const t = tt->GetTrackByIndex(idx);

    if (t == NULL)  // weird
      continue;

    const long tn = t->GetNumber();  // NOLINT

    if (tn <= 0)  // weird
      continue;

    const char* const codec_id = t->GetCodecId();

    if (codec_id == NULL)  // weird
      continue;

    MetadataInfo info;
    info.file = NULL;

    if (strcmp(codec_id, "D_WEBVTT/SUBTITLES") == 0) {
      info.type = MetadataInfo::kSubtitles;
    } else if (strcmp(codec_id, "D_WEBVTT/CAPTIONS") == 0) {
      info.type = MetadataInfo::kCaptions;
    } else if (strcmp(codec_id, "D_WEBVTT/DESCRIPTIONS") == 0) {
      info.type = MetadataInfo::kDescriptions;
    } else if (strcmp(codec_id, "D_WEBVTT/METADATA") == 0) {
      info.type = MetadataInfo::kMetadata;
    } else {
      continue;
    }

    m[tn] = info;  // create an entry in the cache for this track
  }
}